

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O1

int CfdNormalizeSignature(void *handle,char *signature,char **normalized_signature)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  ByteData result;
  allocator local_81;
  undefined1 local_80 [32];
  ByteData local_60;
  ByteData local_48;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(signature);
  if (bVar1) {
    local_80._0_8_ = "cfdcapi_key.cpp";
    local_80._8_4_ = 0x3d1;
    local_80._16_8_ = "CfdNormalizeSignature";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_80,kCfdLogLevelWarning,"signature is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_80._0_8_ = local_80 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_80,"Failed to parameter. signature is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_80);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (normalized_signature != (char **)0x0) {
    std::__cxx11::string::string((string *)local_80,signature,&local_81);
    cfd::core::ByteData::ByteData(&local_60,(string *)local_80);
    cfd::core::CryptoUtil::NormalizeSignature(&local_48,&local_60);
    if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
      operator_delete((void *)local_80._0_8_);
    }
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_80,&local_48);
    pcVar2 = cfd::capi::CreateString((string *)local_80);
    *normalized_signature = pcVar2;
    if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
      operator_delete((void *)local_80._0_8_);
    }
    if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return 0;
  }
  local_80._0_8_ = "cfdcapi_key.cpp";
  local_80._8_4_ = 0x3d7;
  local_80._16_8_ = "CfdNormalizeSignature";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_80,kCfdLogLevelWarning,"normalized_signature is null.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_80._0_8_ = local_80 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_80,"Failed to parameter. normalized_signature is null.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_80);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdNormalizeSignature(
    void* handle, const char* signature, char** normalized_signature) {
  try {
    cfd::Initialize();
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }
    if (normalized_signature == nullptr) {
      warn(CFD_LOG_SOURCE, "normalized_signature is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. normalized_signature is null.");
    }

    ByteData result = CryptoUtil::NormalizeSignature(ByteData(signature));
    *normalized_signature = CreateString(result.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}